

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WasmByteCodeGenerator.cpp
# Opt level: O3

EmitInfo __thiscall Wasm::WasmBytecodeGenerator::EmitGetGlobal(WasmBytecodeGenerator *this)

{
  WasmType type;
  uint uVar1;
  WasmBinaryReader *pWVar2;
  WasmGlobal *global;
  WasmRegisterSpace *this_00;
  EmitInfo EVar3;
  
  pWVar2 = (WasmBinaryReader *)(this->m_funcInfo->m_customReader).ptr;
  if (pWVar2 == (WasmBinaryReader *)0x0) {
    pWVar2 = (this->m_module->m_reader).ptr;
  }
  global = Js::WebAssemblyModule::GetGlobal
                     (this->m_module,
                      (pWVar2->super_WasmReaderBase).m_currentNode.field_1.brTable.numTargets);
  type = global->m_type;
  uVar1 = Js::WebAssemblyModule::GetOffsetForGlobal(this->m_module,global);
  this_00 = GetRegisterSpace(this,type);
  EVar3.super_EmitInfoBase.location = WAsmJs::RegisterSpace::AcquireTmpRegister(this_00);
  (*this->m_writer->_vptr_IWasmByteCodeWriter[0x18])
            (this->m_writer,(ulong)EmitGetGlobal::globalOpcodes[(int)(type - FirstLocalType)],
             (ulong)EVar3.super_EmitInfoBase.location,1,(ulong)uVar1);
  EVar3.type = type;
  return EVar3;
}

Assistant:

EmitInfo WasmBytecodeGenerator::EmitGetGlobal()
{
    uint32 globalIndex = GetReader()->m_currentNode.var.num;
    WasmGlobal* global = m_module->GetGlobal(globalIndex);

    WasmTypes::WasmType type = global->GetType();

    Js::RegSlot slot = m_module->GetOffsetForGlobal(global);

    CompileAssert(WasmTypes::I32 == 1);
    CompileAssert(WasmTypes::I64 == 2);
    CompileAssert(WasmTypes::F32 == 3);
    CompileAssert(WasmTypes::F64 == 4);
    static const Js::OpCodeAsmJs globalOpcodes[] = {
        Js::OpCodeAsmJs::LdSlot_Int,
        Js::OpCodeAsmJs::LdSlot_Long,
        Js::OpCodeAsmJs::LdSlot_Flt,
        Js::OpCodeAsmJs::LdSlot_Db
    };

    WasmRegisterSpace* regSpace = GetRegisterSpace(type);
    Js::RegSlot tmpReg = regSpace->AcquireTmpRegister();
    EmitInfo info(tmpReg, type);

    m_writer->AsmSlot(globalOpcodes[type - 1], tmpReg, WasmBytecodeGenerator::ModuleEnvRegister, slot);

    return info;
}